

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::
argument_loader<pybind11::detail::value_and_holder&,ReadThreadsGraph_const&,int,float,int,int,int>::
load_impl_sequence<0ul,1ul,2ul,3ul,4ul,5ul,6ul>
          (argument_loader<pybind11::detail::value_and_holder&,ReadThreadsGraph_const&,int,float,int,int,int>
           *this,long call)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  undefined8 uVar1;
  handle hVar2;
  long lVar3;
  bool bVar4;
  undefined8 in_RAX;
  long lVar5;
  reference rVar6;
  undefined8 uStack_38;
  
  uVar1 = **(undefined8 **)(call + 8);
  this_00 = (vector<bool,_std::allocator<bool>_> *)(call + 0x20);
  uStack_38 = in_RAX;
  std::vector<bool,_std::allocator<bool>_>::operator[](this_00,0);
  *(undefined8 *)(this + 0x30) = uVar1;
  uStack_38._0_2_ = CONCAT11(1,(undefined1)uStack_38);
  hVar2.m_ptr = *(PyObject **)(*(long *)(call + 8) + 8);
  rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,1);
  bVar4 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x18),hVar2,(*rVar6._M_p & rVar6._M_mask) != 0);
  uStack_38._0_3_ = CONCAT12(bVar4,(undefined2)uStack_38);
  hVar2.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x10);
  rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,2);
  bVar4 = type_caster<int,_void>::load
                    ((type_caster<int,_void> *)(this + 0x10),hVar2,
                     (*rVar6._M_p & rVar6._M_mask) != 0);
  uStack_38._0_4_ = CONCAT13(bVar4,(undefined3)uStack_38);
  hVar2.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x18);
  rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,3);
  bVar4 = type_caster<float,_void>::load
                    ((type_caster<float,_void> *)(this + 0xc),hVar2,
                     (*rVar6._M_p & rVar6._M_mask) != 0);
  uStack_38._0_5_ = CONCAT14(bVar4,(undefined4)uStack_38);
  hVar2.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x20);
  rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,4);
  bVar4 = type_caster<int,_void>::load
                    ((type_caster<int,_void> *)(this + 8),hVar2,(*rVar6._M_p & rVar6._M_mask) != 0);
  uStack_38._0_6_ = CONCAT15(bVar4,(undefined5)uStack_38);
  hVar2.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x28);
  rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,5);
  bVar4 = type_caster<int,_void>::load
                    ((type_caster<int,_void> *)(this + 4),hVar2,(*rVar6._M_p & rVar6._M_mask) != 0);
  uStack_38._0_7_ = CONCAT16(bVar4,(undefined6)uStack_38);
  hVar2.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x30);
  rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,6);
  type_caster<int,_void>::load
            ((type_caster<int,_void> *)this,hVar2,(*rVar6._M_p & rVar6._M_mask) != 0);
  lVar3 = 0;
  do {
    lVar5 = lVar3;
    if (lVar5 == 7) break;
    lVar3 = lVar5 + 1;
  } while (*(char *)((long)&uStack_38 + lVar5 + 1) != '\0');
  return lVar5 == 7;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }